

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O2

void k051649_w(void *chip,UINT8 offset,UINT8 data)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint *puVar4;
  long lVar5;
  uint uVar6;
  k051649_state *info;
  
  if ((offset & 1) == 0) {
    *(UINT8 *)((long)chip + 0x101) = data;
    return;
  }
  switch(offset >> 1) {
  case '\0':
  case '\x04':
    bVar1 = *(byte *)((long)chip + 0x100);
    if (*(char *)((long)chip + 0x102) == '\0') {
      if (((bVar1 & 0x40) == 0) &&
         (bVar2 = *(byte *)((long)chip + 0x101), -1 < (char)bVar1 || bVar2 < 0x60)) {
        if (bVar2 < 0x60) {
          lVar5 = (ulong)(bVar2 & 0x1f) + (ulong)(bVar2 >> 5) * 0x2c + 0x12;
        }
        else {
          uVar3 = bVar2 & 0x1f;
          lVar5 = (ulong)uVar3 + 0xc2;
          *(UINT8 *)((long)chip + (ulong)uVar3 + 0x96) = data;
        }
        *(UINT8 *)((long)chip + lVar5) = data;
        return;
      }
    }
    else if ((bVar1 & 0x40) == 0) {
      *(UINT8 *)((long)chip +
                (ulong)(*(byte *)((long)chip + 0x101) & 0x1f) + 0x12 +
                (ulong)(*(byte *)((long)chip + 0x101) >> 5) * 0x2c) = data;
      return;
    }
    break;
  case '\x01':
    bVar1 = *(byte *)((long)chip + 0x101);
    bVar2 = bVar1 >> 1;
    puVar4 = (uint *)((long)chip + (ulong)bVar2 * 0x2c + 8);
    uVar3 = *(uint *)((long)chip + (ulong)bVar2 * 0x2c + 0xc);
    if ((*(byte *)((long)chip + 0x100) & 0x20) == 0) {
      if (8 < (int)uVar3) goto LAB_001598b6;
      uVar6 = *puVar4 | 0xffff;
    }
    else {
      uVar6 = 0xffffffff;
    }
    *puVar4 = uVar6;
LAB_001598b6:
    uVar6 = (uint)data;
    if ((bVar1 & 1) == 0) {
      uVar3 = uVar3 & 0xf00;
    }
    else {
      uVar3 = uVar3 & 0xff;
      uVar6 = (data & 0xf) << 8;
    }
    *(uint *)((long)chip + (ulong)bVar2 * 0x2c + 0xc) = uVar6 | uVar3;
    *puVar4 = (uint)*(ushort *)((long)chip + (ulong)bVar2 * 0x2c + 10) << 0x10;
    return;
  case '\x02':
    *(byte *)((long)chip + (ulong)(*(byte *)((long)chip + 0x101) & 7) * 0x2c + 0x10) = data & 0xf;
    return;
  case '\x03':
    for (lVar5 = 0x11; lVar5 != 0xed; lVar5 = lVar5 + 0x2c) {
      *(byte *)((long)chip + lVar5) = data & 1;
      data = data >> 1;
    }
    break;
  case '\x05':
    *(UINT8 *)((long)chip + 0x100) = data;
    return;
  }
  return;
}

Assistant:

static void k051649_w(void *chip, UINT8 offset, UINT8 data)
{
	k051649_state *info = (k051649_state *)chip;
	
	switch(offset & 1)
	{
	case 0x00:
		info->cur_reg = data;
		break;
	case 0x01:
		switch(offset >> 1)
		{
		case 0x00:
		case 0x04:
			if (! info->mode_plus)
				k051649_waveform_w(chip, info->cur_reg, data);
			else
				k052539_waveform_w(chip, info->cur_reg, data);
			break;
		case 0x01:
			k051649_frequency_w(chip, info->cur_reg, data);
			break;
		case 0x02:
			k051649_volume_w(chip, info->cur_reg, data);
			break;
		case 0x03:
			k051649_keyonoff_w(chip, info->cur_reg, data);
			break;
		case 0x05:
			k051649_test_w(chip, info->cur_reg, data);
			break;
		}
		break;
	}
	
	return;
}